

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool cs::compiler_type::find_id_ref(iterator it,string *id)

{
  token_base *ptVar1;
  size_t __n;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  token_base **pptVar6;
  iterator iVar7;
  tree_type<cs::token_base_*> *tree;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  size_t sVar10;
  iterator local_38;
  
  if (it.mData != (tree_node *)0x0) {
    local_38.mData = it.mData;
    pptVar6 = tree_type<cs::token_base_*>::iterator::data(&local_38);
    ptVar1 = *pptVar6;
    if (ptVar1 != (token_base *)0x0) {
      iVar5 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar5 == 0xe) {
        pp_Var8 = ptVar1[2]._vptr_token_base;
        pp_Var2 = ptVar1[4]._vptr_token_base;
        bVar4 = pp_Var8 != pp_Var2;
        if (!bVar4) {
          return bVar4;
        }
        pp_Var9 = ptVar1[3]._vptr_token_base;
        sVar10 = ptVar1[3].line_num;
        do {
          bVar3 = find_id_ref((tree_node *)*pp_Var8,id);
          if (bVar3) {
            return bVar4;
          }
          pp_Var8 = pp_Var8 + 1;
          if (pp_Var8 == pp_Var9) {
            pp_Var8 = *(_func_int ***)(sVar10 + 8);
            sVar10 = sVar10 + 8;
            pp_Var9 = pp_Var8 + 0x40;
          }
          bVar4 = pp_Var8 != pp_Var2;
        } while (bVar4);
        return bVar4;
      }
      if (iVar5 == 0xc) {
        pptVar6 = tree_type<cs::token_base_*>::iterator::data(&local_38);
        iVar7.mData = (tree_node *)(*pptVar6)[1]._vptr_token_base;
      }
      else {
        if (iVar5 == 4) {
          __n = ptVar1[3].line_num;
          if (__n != id->_M_string_length) {
            return false;
          }
          if (__n == 0) {
            return true;
          }
          iVar5 = bcmp(ptVar1[3]._vptr_token_base,(id->_M_dataplus)._M_p,__n);
          return iVar5 == 0;
        }
        iVar7 = tree_type<cs::token_base_*>::iterator::left(&local_38);
        bVar4 = find_id_ref(iVar7,id);
        if (bVar4) {
          return true;
        }
        iVar7 = tree_type<cs::token_base_*>::iterator::right(&local_38);
      }
      bVar4 = find_id_ref(iVar7,id);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool compiler_type::find_id_ref(tree_type<token_base *>::iterator it, const std::string &id)
	{
		if (!it.usable())
			return false;
		token_base *token = it.data();
		if (token == nullptr)
			return false;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id:
			return static_cast<token_id *>(token)->get_id().get_id() == id;
		case token_types::expr:
			return find_id_ref(static_cast<token_expr *>(it.data())->get_tree().root(), id);
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				if (find_id_ref(tree.root(), id))
					return true;
			}
			return false;
		}
		}
		if (find_id_ref(it.left(), id) || find_id_ref(it.right(), id))
			return true;
		else
			return false;
	}